

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangemap.hh
# Opt level: O0

pair<rangemap<ScopeMapper>::PartIterator,_rangemap<ScopeMapper>::PartIterator> __thiscall
rangemap<ScopeMapper>::find(rangemap<ScopeMapper> *this,linetype *point)

{
  bool bVar1;
  reference pAVar2;
  bool local_159;
  PartIterator local_150;
  _Base_ptr local_148;
  PartIterator local_140;
  _Base_ptr local_138;
  NullSubsort local_129;
  Address local_128;
  undefined1 local_118 [8];
  AddrRange addrend;
  PartIterator local_c0;
  _Base_ptr local_b8;
  PartIterator local_b0;
  _Self local_a8;
  _Base_ptr local_a0;
  const_iterator local_98;
  const_iterator iter2;
  const_iterator iter1;
  undefined1 local_78 [8];
  AddrRange addrrange;
  linetype *point_local;
  rangemap<ScopeMapper> *this_local;
  
  addrrange.value._M_node = (_List_node_base *)point;
  Address::Address((Address *)&iter1,point);
  AddrRange::AddrRange((AddrRange *)local_78,(linetype *)&iter1);
  std::_Rb_tree_const_iterator<rangemap<ScopeMapper>::AddrRange>::_Rb_tree_const_iterator(&iter2);
  std::_Rb_tree_const_iterator<rangemap<ScopeMapper>::AddrRange>::_Rb_tree_const_iterator(&local_98)
  ;
  local_a0 = (_Base_ptr)
             std::
             multiset<rangemap<ScopeMapper>::AddrRange,_std::less<rangemap<ScopeMapper>::AddrRange>,_std::allocator<rangemap<ScopeMapper>::AddrRange>_>
             ::lower_bound(&this->tree,(key_type *)local_78);
  iter2._M_node = local_a0;
  local_a8._M_node =
       (_Base_ptr)
       std::
       multiset<rangemap<ScopeMapper>::AddrRange,_std::less<rangemap<ScopeMapper>::AddrRange>,_std::allocator<rangemap<ScopeMapper>::AddrRange>_>
       ::end(&this->tree);
  bVar1 = std::operator==(&iter2,&local_a8);
  local_159 = true;
  if (!bVar1) {
    pAVar2 = std::_Rb_tree_const_iterator<rangemap<ScopeMapper>::AddrRange>::operator*(&iter2);
    local_159 = Address::operator<(point,&pAVar2->first);
  }
  if (local_159 == false) {
    pAVar2 = std::_Rb_tree_const_iterator<rangemap<ScopeMapper>::AddrRange>::operator*(&iter2);
    Address::Address(&local_128,&pAVar2->last);
    ScopeMapper::NullSubsort::NullSubsort(&local_129,true);
    AddrRange::AddrRange((AddrRange *)local_118,&local_128,&local_129);
    local_138 = (_Base_ptr)
                std::
                multiset<rangemap<ScopeMapper>::AddrRange,_std::less<rangemap<ScopeMapper>::AddrRange>,_std::allocator<rangemap<ScopeMapper>::AddrRange>_>
                ::upper_bound(&this->tree,(key_type *)local_118);
    local_148 = iter2._M_node;
    local_98 = (const_iterator)local_138;
    PartIterator::PartIterator(&local_140,iter2);
    PartIterator::PartIterator(&local_150,local_98);
    std::pair<rangemap<ScopeMapper>::PartIterator,_rangemap<ScopeMapper>::PartIterator>::
    pair<rangemap<ScopeMapper>::PartIterator,_rangemap<ScopeMapper>::PartIterator,_true>
              ((pair<rangemap<ScopeMapper>::PartIterator,_rangemap<ScopeMapper>::PartIterator> *)
               &this_local,&local_140,&local_150);
  }
  else {
    local_b8 = iter2._M_node;
    PartIterator::PartIterator(&local_b0,iter2);
    addrend.value._M_node = (_List_node_base *)iter2._M_node;
    PartIterator::PartIterator(&local_c0,iter2);
    std::pair<rangemap<ScopeMapper>::PartIterator,_rangemap<ScopeMapper>::PartIterator>::
    pair<rangemap<ScopeMapper>::PartIterator,_rangemap<ScopeMapper>::PartIterator,_true>
              ((pair<rangemap<ScopeMapper>::PartIterator,_rangemap<ScopeMapper>::PartIterator> *)
               &this_local,&local_b0,&local_c0);
  }
  return _this_local;
}

Assistant:

std::pair<typename rangemap<_recordtype>::const_iterator,typename rangemap<_recordtype>::const_iterator>
rangemap<_recordtype>::find(linetype point) const

{
  AddrRange addrrange(point);
  typename std::multiset<AddrRange>::const_iterator iter1,iter2;

  iter1 = tree.lower_bound(addrrange);
  // Check for no intersection
  if ((iter1==tree.end())||(point < (*iter1).first))
    return std::pair<PartIterator,PartIterator>(PartIterator(iter1),PartIterator(iter1));

  AddrRange addrend((*iter1).last,subsorttype(true));
  iter2 = tree.upper_bound(addrend);
    
  return std::pair<PartIterator,PartIterator>(PartIterator(iter1),PartIterator(iter2));
}